

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManPlaceRandom(Frc_Man_t *p)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  bool bVar4;
  int local_34;
  int Counter;
  int iNext;
  int Temp;
  int h;
  int i;
  int *pPlacement;
  Frc_Obj_t *pThis;
  Frc_Man_t *p_local;
  
  __ptr = malloc((long)p->nObjs << 2);
  for (Temp = 0; Temp < p->nObjs; Temp = Temp + 1) {
    *(int *)((long)__ptr + (long)Temp * 4) = Temp;
  }
  for (Temp = 0; Temp < p->nObjs; Temp = Temp + 1) {
    uVar2 = Gia_ManRandom(0);
    uVar2 = uVar2 % (uint)p->nObjs;
    uVar1 = *(undefined4 *)((long)__ptr + (long)Temp * 4);
    *(undefined4 *)((long)__ptr + (long)Temp * 4) =
         *(undefined4 *)((long)__ptr + (long)(int)uVar2 * 4);
    *(undefined4 *)((long)__ptr + (long)(int)uVar2 * 4) = uVar1;
  }
  local_34 = 0;
  iNext = 0;
  while( true ) {
    bVar4 = false;
    if (iNext < p->nObjData) {
      pPlacement = (int *)Frc_ManObj(p,iNext);
      bVar4 = (Frc_Obj_t *)pPlacement != (Frc_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pPlacement[4] = *(int *)((long)__ptr + (long)local_34 * 4);
    iVar3 = Frc_ObjSize((Frc_Obj_t *)pPlacement);
    iNext = iVar3 + iNext;
    local_34 = local_34 + 1;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Frc_ManPlaceRandom( Frc_Man_t * p )
{
    Frc_Obj_t * pThis;
    int * pPlacement;
    int i, h, Temp, iNext, Counter;
    pPlacement = ABC_ALLOC( int, p->nObjs );
    for ( i = 0; i < p->nObjs; i++ )
        pPlacement[i] = i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % p->nObjs;
        Temp = pPlacement[i];
        pPlacement[i] = pPlacement[iNext];
        pPlacement[iNext] = Temp;
    }
    Counter = 0;
    Frc_ManForEachObj( p, pThis, h )
        pThis->pPlace = pPlacement[Counter++];
    ABC_FREE( pPlacement );
}